

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

sim_result * analyzeConflict(Abc_Ntk_t *pNtk,int *pModel,int fVerbose)

{
  uint uVar1;
  void **ppvVar2;
  sim_result *psVar3;
  int *piVar4;
  int *piVar5;
  int *__ptr;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  
  iVar8 = pNtk->vPos->nSize;
  uVar1 = pNtk->vPis->nSize;
  psVar3 = (sim_result *)malloc(0x20);
  piVar4 = (int *)malloc((long)(int)uVar1 * 4);
  psVar3->inVec = piVar4;
  piVar5 = (int *)malloc((long)iVar8 << 2);
  psVar3->outVec = piVar5;
  __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    ppvVar2 = pVVar6->pArray;
    lVar9 = 0;
    do {
      piVar4[*(int *)((long)ppvVar2[lVar9] + 0x10) - 1] = pModel[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vCos;
  if (pVVar6->nSize < 1) {
    iVar8 = 0;
  }
  else {
    ppvVar2 = pVVar6->pArray;
    lVar9 = 0;
    iVar8 = 0;
    do {
      piVar5[*(int *)((long)ppvVar2[lVar9] + 0x10) + ~uVar1] = __ptr[lVar9];
      iVar8 = (iVar8 + 1) - (uint)(__ptr[lVar9] == 0);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  psVar3->outVecOnes = iVar8;
  psVar3->activity = 0.0;
  if (fVerbose != 0) {
    pVVar6 = pNtk->vCis;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        pcVar7 = Abc_ObjName((Abc_Obj_t *)pVVar6->pArray[lVar9]);
        printf(" %s=%d",pcVar7,(ulong)(uint)pModel[lVar9]);
        lVar9 = lVar9 + 1;
        pVVar6 = pNtk->vCis;
      } while (lVar9 < pVVar6->nSize);
    }
    putchar(10);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return psVar3;
}

Assistant:

static struct sim_result *
analyzeConflict( Abc_Ntk_t * pNtk, int * pModel, int fVerbose )
{   
    Abc_Obj_t * pNode;
    int i, count = 0;
    int * pValues;
    struct sim_result * cex;
    int numouts = Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);
    
    cex = ABC_ALLOC(struct sim_result, 1);  
    cex->inVec = ints( numins );
    cex->outVec =  ints( numouts ); 

    /* get the CO values under this model */
    pValues = Abc_NtkVerifySimulatePattern( pNtk, pModel );    

    Abc_NtkForEachCi( pNtk, pNode, i ) 
        cex->inVec[Abc_ObjId(pNode)-1] = pModel[i];
    Abc_NtkForEachCo( pNtk, pNode, i ) {
        cex->outVec[Abc_ObjId(pNode)-numins-1] = pValues[i];
        if (pValues[i]) count++;
    }   
    
    cex->outVecOnes = count;
    cex->activity = 0;  

    if (fVerbose) {
        Abc_NtkForEachCi( pNtk, pNode, i )
            printf(" %s=%d", Abc_ObjName(pNode), pModel[i]);
        printf("\n");
    }

    ABC_FREE( pValues );    

    return cex;
}